

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

uint64_t __thiscall llvm::APInt::getZExtValue(APInt *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = this->BitWidth;
  if (0x40 < uVar1) {
    uVar2 = countLeadingZerosSlowCase(this);
    if (0x40 < uVar1 - uVar2) {
      __assert_fail("getActiveBits() <= 64 && \"Too many bits for uint64_t\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                    ,0x617,"uint64_t llvm::APInt::getZExtValue() const");
    }
    this = (APInt *)(this->U).VAL;
  }
  return (this->U).VAL;
}

Assistant:

uint64_t getZExtValue() const {
    if (isSingleWord())
      return U.VAL;
    assert(getActiveBits() <= 64 && "Too many bits for uint64_t");
    return U.pVal[0];
  }